

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

void embree::avx512::InstanceIntersector1MB::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Instance *pIVar8;
  RTCRayQueryContext *pRVar9;
  long lVar10;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined8 uVar13;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  uint uVar27;
  uint uVar28;
  AffineSpace3ff *pAVar29;
  int iVar30;
  undefined8 unaff_R13;
  AffineSpace3ff *pAVar31;
  uint uVar32;
  uint uVar33;
  float fVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined4 uVar50;
  float fVar51;
  vfloat4 a0_2;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vfloat4 a0;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  vfloat4 a0_1;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vfloat4 b0;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vfloat4 a1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  RayQueryContext newcontext;
  
  pIVar8 = prim->instance;
  if ((((ray->super_RayK<1>).mask & (pIVar8->super_Geometry).mask) != 0) &&
     (pRVar9 = context->user, pRVar9->instID[0] == 0xffffffff)) {
    pRVar9->instID[0] = prim->instID_;
    pRVar9->instPrimID[0] = 0;
    if ((pIVar8->super_Geometry).numTimeSteps == 1) {
      aVar5 = (pIVar8->world2local0).l.vx.field_0;
      aVar6 = (pIVar8->world2local0).l.vy.field_0;
      aVar7 = (pIVar8->world2local0).l.vz.field_0;
      aVar35 = (pIVar8->world2local0).p.field_0;
    }
    else {
      fVar51 = (pIVar8->super_Geometry).fnumTimeSegments;
      fVar68 = (pIVar8->super_Geometry).time_range.lower;
      fVar68 = fVar51 * (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar68) /
                        ((pIVar8->super_Geometry).time_range.upper - fVar68));
      auVar36 = vroundss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68),9);
      auVar36 = vminss_avx(auVar36,ZEXT416((uint)(fVar51 + -1.0)));
      auVar37._0_12_ = ZEXT812(0);
      auVar37._12_4_ = 0;
      auVar36 = vmaxss_avx(auVar37,auVar36);
      fVar68 = fVar68 - auVar36._0_4_;
      iVar30 = (int)auVar36._0_4_;
      pAVar29 = pIVar8->local2world + CONCAT44((int)((ulong)unaff_R13 >> 0x20),iVar30);
      pAVar31 = pIVar8->local2world + (iVar30 + 1);
      if ((pIVar8->super_Geometry).field_8.field_0x1 == '\x01') {
        uVar27 = *(uint *)((long)&(pAVar29->p).field_0 + 0xc);
        uVar1 = *(uint *)((long)&(pAVar29->l).vx.field_0 + 0xc);
        uVar2 = *(uint *)((long)&(pAVar29->l).vy.field_0 + 0xc);
        uVar3 = *(uint *)((long)&(pAVar29->l).vz.field_0 + 0xc);
        uVar28 = *(uint *)((long)&(pAVar31->p).field_0 + 0xc);
        uVar32 = *(uint *)((long)&(pAVar31->l).vx.field_0 + 0xc);
        uVar33 = *(uint *)((long)&(pAVar31->l).vy.field_0 + 0xc);
        uVar4 = *(uint *)((long)&(pAVar31->l).vz.field_0 + 0xc);
        auVar36 = vmulss_avx512f(ZEXT416(uVar1),ZEXT416(uVar32));
        auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar27),ZEXT416(uVar28));
        auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar2),ZEXT416(uVar33));
        auVar37 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar3),ZEXT416(uVar4));
        auVar40._8_4_ = 0x80000000;
        auVar40._0_8_ = 0x8000000080000000;
        auVar40._12_4_ = 0x80000000;
        auVar41._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
        auVar41._8_4_ = auVar37._8_4_ ^ 0x80000000;
        auVar41._12_4_ = auVar37._12_4_ ^ 0x80000000;
        bVar14 = auVar37._0_4_ < -auVar37._0_4_;
        auVar36 = vxorps_avx512vl(ZEXT416(uVar28),auVar40);
        auVar38 = vxorps_avx512vl(ZEXT416(uVar32),auVar40);
        auVar39 = vxorps_avx512vl(ZEXT416(uVar33),auVar40);
        auVar40 = vxorps_avx512vl(ZEXT416(uVar4),auVar40);
        auVar45 = ZEXT416((uint)bVar14 * auVar36._0_4_ + !bVar14 * uVar28);
        auVar38 = ZEXT416((uint)bVar14 * auVar38._0_4_ + !bVar14 * uVar32);
        auVar39 = ZEXT416((uint)bVar14 * auVar39._0_4_ + !bVar14 * uVar33);
        auVar40 = ZEXT416((uint)bVar14 * auVar40._0_4_ + !bVar14 * uVar4);
        auVar41 = vmaxss_avx512f(auVar41,auVar37);
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar37 = vandps_avx512vl(auVar37,auVar36);
        auVar36 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar37,ZEXT416(0x3c9df1b8));
        auVar36 = vfmadd213ss_fma(auVar36,auVar37,ZEXT416(0xbd37e81c));
        auVar36 = vfmadd213ss_fma(auVar36,auVar37,ZEXT416(0x3db3edac));
        auVar36 = vfmadd213ss_fma(auVar36,auVar37,ZEXT416(0xbe5ba881));
        auVar36 = vfmadd213ss_fma(auVar36,auVar37,ZEXT416(0x3fc90fd1));
        auVar42 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
        if (auVar42._0_4_ < 0.0) {
          fVar51 = sqrtf(auVar42._0_4_);
          auVar41 = ZEXT416(auVar41._0_4_);
        }
        else {
          auVar42 = vsqrtss_avx(auVar42,auVar42);
          fVar51 = auVar42._0_4_;
        }
        auVar47 = ZEXT416(uVar27);
        auVar48 = ZEXT416(0x3f800000);
        auVar46 = ZEXT416((uint)fVar68);
        auVar36 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar51 * auVar36._0_4_)))
        ;
        uVar13 = vcmpss_avx512f(auVar41,ZEXT816(0) << 0x40,1);
        bVar14 = (bool)((byte)uVar13 & 1);
        uVar13 = vcmpss_avx512f(auVar48,auVar37,1);
        bVar16 = (bool)((byte)uVar13 & 1);
        fVar51 = fVar68 * (float)((uint)bVar16 * 0x7fc00000 +
                                 (uint)!bVar16 *
                                 (int)(1.5707964 -
                                      (float)((uint)bVar14 * (auVar36._0_4_ ^ 0x80000000) +
                                             (uint)!bVar14 * auVar36._0_4_)));
        auVar36 = ZEXT416((uint)(fVar51 * 0.63661975));
        auVar36 = vroundss_avx(auVar36,auVar36,9);
        auVar37 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar36,ZEXT416((uint)fVar51));
        uVar27 = (int)auVar36._0_4_ & 3;
        uVar28 = uVar27 - 1;
        fVar34 = auVar37._0_4_;
        fVar51 = fVar34 * fVar34;
        auVar37 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar51),
                                  ZEXT416(0x363938a8));
        auVar42 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar51),
                                  ZEXT416(0x37cfab9c));
        auVar49 = ZEXT416((uint)fVar51);
        auVar37 = vfmadd213ss_fma(auVar37,auVar49,ZEXT416(0xb9501096));
        auVar42 = vfmadd213ss_fma(auVar42,auVar49,ZEXT416(0xbab60981));
        auVar37 = vfmadd213ss_fma(auVar37,auVar49,ZEXT416(0x3c088898));
        auVar42 = vfmadd213ss_fma(auVar42,auVar49,ZEXT416(0x3d2aaaa4));
        auVar49 = ZEXT416((uint)fVar51);
        auVar37 = vfmadd213ss_fma(auVar37,auVar49,ZEXT416(0xbe2aaaab));
        auVar42 = vfmadd213ss_fma(auVar42,auVar49,SUB6416(ZEXT464(0xbf000000),0));
        auVar37 = vfmadd213ss_avx512f(auVar37,auVar49,auVar48);
        auVar42 = vfmadd213ss_avx512f(auVar42,auVar49,auVar48);
        fVar34 = fVar34 * auVar37._0_4_;
        bVar15 = (byte)(int)auVar36._0_4_;
        uVar32 = (uint)(bVar15 & 1) * auVar42._0_4_ + (uint)!(bool)(bVar15 & 1) * (int)fVar34;
        auVar49._4_12_ = auVar42._4_12_;
        uVar33 = (uint)(bVar15 & 1) * (int)fVar34 + (uint)!(bool)(bVar15 & 1) * auVar42._0_4_;
        fVar34 = (float)((uint)(1 < uVar27) * (uVar32 ^ 0x80000000) + (1 >= uVar27) * uVar32);
        auVar49._0_4_ = (uint)(uVar28 < 2) * (uVar33 ^ 0x80000000) + (uVar28 >= 2) * uVar33;
        auVar37 = vfmsub213ss_avx512f(auVar47,auVar41,auVar45);
        auVar36 = vfmsub213ss_avx512f(ZEXT416(uVar1),auVar41,auVar38);
        auVar42 = vfmsub213ss_avx512f(ZEXT416(uVar2),auVar41,auVar39);
        auVar43 = vfmsub213ss_avx512f(ZEXT416(uVar3),auVar41,auVar40);
        fVar61 = auVar36._0_4_;
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar61)),auVar37,auVar37);
        auVar36 = vfmadd231ss_fma(auVar36,auVar42,auVar42);
        auVar36 = vfmadd231ss_fma(auVar36,auVar43,auVar43);
        auVar53 = ZEXT816(0) << 0x20;
        auVar41 = vrsqrt14ss_avx512f(auVar53,ZEXT416((uint)auVar36._0_4_));
        fVar51 = auVar41._0_4_;
        fVar51 = fVar51 * 1.5 + fVar51 * fVar51 * fVar51 * auVar36._0_4_ * -0.5;
        auVar44 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar51 * auVar37._0_4_ * fVar34)),auVar49,
                                      auVar47);
        auVar41 = vfmsub231ss_fma(ZEXT416((uint)(fVar51 * fVar61 * fVar34)),auVar49,ZEXT416(uVar1));
        auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar51 * auVar42._0_4_ * fVar34)),auVar49,
                                  ZEXT416(uVar2));
        auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar51 * auVar43._0_4_ * fVar34)),ZEXT416(uVar3),
                                  auVar49);
        auVar43 = vsubss_avx512f(auVar48,auVar46);
        auVar36 = vmulss_avx512f(auVar46,auVar45);
        auVar45 = vfmadd231ss_avx512f(auVar36,auVar43,auVar47);
        auVar36 = vmulss_avx512f(auVar46,auVar38);
        auVar36 = vfmadd231ss_fma(auVar36,auVar43,ZEXT416(uVar1));
        auVar37 = vmulss_avx512f(auVar46,auVar39);
        auVar37 = vfmadd231ss_fma(auVar37,auVar43,ZEXT416(uVar2));
        auVar38 = vmulss_avx512f(auVar46,auVar40);
        auVar38 = vfmadd231ss_fma(auVar38,auVar43,ZEXT416(uVar3));
        fVar34 = auVar36._0_4_;
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar45,auVar45);
        auVar36 = vfmadd231ss_fma(auVar36,auVar37,auVar37);
        auVar36 = vfmadd231ss_fma(auVar36,auVar38,auVar38);
        auVar39 = vrsqrt14ss_avx512f(auVar53,ZEXT416((uint)auVar36._0_4_));
        fVar51 = auVar39._0_4_;
        fVar51 = fVar51 * 1.5 + fVar51 * fVar51 * fVar51 * auVar36._0_4_ * -0.5;
        vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
        bVar14 = 2 < uVar28;
        auVar44._0_4_ =
             (float)((uint)bVar14 * (int)(auVar45._0_4_ * fVar51) + (uint)!bVar14 * auVar44._0_4_);
        auVar46._4_12_ = auVar41._4_12_;
        auVar46._0_4_ =
             (float)((uint)bVar14 * (int)(fVar34 * fVar51) + (uint)!bVar14 * auVar41._0_4_);
        auVar47._4_12_ = auVar42._4_12_;
        auVar47._0_4_ =
             (float)((uint)bVar14 * (int)(auVar37._0_4_ * fVar51) + (uint)!bVar14 * auVar42._0_4_);
        auVar48._4_12_ = auVar49._4_12_;
        auVar48._0_4_ =
             (float)((uint)bVar14 * (int)(auVar38._0_4_ * fVar51) + (uint)!bVar14 * auVar49._0_4_);
        auVar76._0_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[0];
        auVar76._4_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[1];
        auVar76._8_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[2];
        auVar76._12_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[3];
        uVar50 = auVar43._0_4_;
        auVar78._4_4_ = uVar50;
        auVar78._0_4_ = uVar50;
        auVar78._8_4_ = uVar50;
        auVar78._12_4_ = uVar50;
        auVar37 = vfmadd231ps_fma(auVar76,auVar78,(undefined1  [16])(pAVar29->l).vx.field_0);
        auVar74._0_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[0];
        auVar74._4_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[1];
        auVar74._8_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[2];
        auVar74._12_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[3];
        auVar38 = vfmadd231ps_fma(auVar74,auVar78,(undefined1  [16])(pAVar29->l).vy.field_0);
        auVar72._0_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[0];
        auVar72._4_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[1];
        auVar72._8_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[2];
        auVar72._12_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[3];
        auVar39 = vfmadd231ps_fma(auVar72,auVar78,(undefined1  [16])(pAVar29->l).vz.field_0);
        auVar70._0_4_ = fVar68 * (pAVar31->p).field_0.m128[0];
        auVar70._4_4_ = fVar68 * (pAVar31->p).field_0.m128[1];
        auVar70._8_4_ = fVar68 * (pAVar31->p).field_0.m128[2];
        auVar70._12_4_ = fVar68 * (pAVar31->p).field_0.m128[3];
        auVar41 = vfmadd231ps_fma(auVar70,auVar78,(undefined1  [16])(pAVar29->p).field_0);
        auVar36 = vshufps_avx(auVar37,auVar53,0xe9);
        auVar36 = vblendps_avx(auVar36,auVar38,4);
        auVar40 = vfmadd213ss_fma(auVar44,auVar44,ZEXT416((uint)(auVar46._0_4_ * auVar46._0_4_)));
        auVar40 = vfnmadd231ss_fma(auVar40,auVar47,auVar47);
        auVar42 = vfnmadd231ss_fma(auVar40,auVar48,auVar48);
        auVar40 = vfmadd213ss_fma(auVar47,auVar46,ZEXT416((uint)(auVar44._0_4_ * auVar48._0_4_)));
        fVar51 = auVar40._0_4_ + auVar40._0_4_;
        auVar40 = vfmsub213ss_fma(auVar48,auVar46,ZEXT416((uint)(auVar44._0_4_ * auVar47._0_4_)));
        fVar68 = auVar40._0_4_ + auVar40._0_4_;
        auVar40 = vfmsub231ss_fma(ZEXT416((uint)(auVar44._0_4_ * auVar48._0_4_)),auVar46,auVar47);
        fVar34 = auVar40._0_4_ + auVar40._0_4_;
        auVar45 = vfmsub231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar46._0_4_)),auVar44,auVar44);
        auVar40 = vfmadd213ss_avx512f(auVar47,auVar47,auVar45);
        auVar49 = vfnmadd231ss_avx512f(auVar40,auVar48,auVar48);
        auVar40 = vfmadd213ss_avx512f(auVar48,auVar47,ZEXT416((uint)(auVar44._0_4_ * auVar46._0_4_))
                                     );
        auVar43 = vaddss_avx512f(auVar40,auVar40);
        auVar40 = vfmadd213ss_fma(auVar46,auVar48,ZEXT416((uint)(auVar44._0_4_ * auVar47._0_4_)));
        fVar61 = auVar40._0_4_ + auVar40._0_4_;
        auVar40 = vfmsub231ss_fma(ZEXT416((uint)(auVar44._0_4_ * auVar46._0_4_)),auVar47,auVar48);
        fVar11 = auVar40._0_4_ + auVar40._0_4_;
        auVar40 = vfnmadd231ss_fma(auVar45,auVar47,auVar47);
        auVar45 = vfmadd231ss_fma(auVar40,auVar48,auVar48);
        uVar50 = auVar42._0_4_;
        auVar42._4_4_ = uVar50;
        auVar42._0_4_ = uVar50;
        auVar42._8_4_ = uVar50;
        auVar42._12_4_ = uVar50;
        auVar59._4_4_ = fVar51;
        auVar59._0_4_ = fVar51;
        auVar59._8_4_ = fVar51;
        auVar59._12_4_ = fVar51;
        auVar80._0_4_ = fVar68 * 0.0;
        auVar80._4_4_ = fVar68 * 0.0;
        auVar80._8_4_ = fVar68 * 1.0;
        auVar80._12_4_ = fVar68 * 0.0;
        auVar44 = ZEXT816(0x3f80000000000000);
        auVar40 = vfmadd231ps_fma(auVar80,auVar44,auVar59);
        auVar46 = SUB6416(ZEXT464(0x3f800000),0);
        auVar42 = vfmadd231ps_fma(auVar40,auVar46,auVar42);
        auVar56._4_4_ = fVar34;
        auVar56._0_4_ = fVar34;
        auVar56._8_4_ = fVar34;
        auVar56._12_4_ = fVar34;
        auVar40 = vbroadcastss_avx512vl(auVar49);
        auVar49 = vbroadcastss_avx512vl(auVar43);
        auVar79._0_4_ = auVar49._0_4_ * 0.0;
        auVar79._4_4_ = auVar49._4_4_ * 0.0;
        auVar79._8_4_ = auVar49._8_4_ * 1.0;
        auVar79._12_4_ = auVar49._12_4_ * 0.0;
        auVar40 = vfmadd231ps_fma(auVar79,auVar44,auVar40);
        auVar49 = vfmadd231ps_fma(auVar40,auVar46,auVar56);
        auVar43._4_4_ = fVar61;
        auVar43._0_4_ = fVar61;
        auVar43._8_4_ = fVar61;
        auVar43._12_4_ = fVar61;
        auVar60._4_4_ = fVar11;
        auVar60._0_4_ = fVar11;
        auVar60._8_4_ = fVar11;
        auVar60._12_4_ = fVar11;
        fVar51 = auVar45._0_4_;
        auVar67._0_4_ = fVar51 * 0.0;
        auVar67._4_4_ = fVar51 * 0.0;
        auVar67._8_4_ = fVar51 * 1.0;
        auVar67._12_4_ = fVar51 * 0.0;
        auVar40 = vfmadd231ps_fma(auVar67,auVar44,auVar60);
        auVar40 = vfmadd231ps_fma(auVar40,auVar46,auVar43);
        uVar50 = auVar37._0_4_;
        auVar45._4_4_ = uVar50;
        auVar45._0_4_ = uVar50;
        auVar45._8_4_ = uVar50;
        auVar45._12_4_ = uVar50;
        fVar51 = auVar40._0_4_;
        auVar63._0_4_ = fVar51 * 0.0;
        fVar68 = auVar40._4_4_;
        auVar63._4_4_ = fVar68 * 0.0;
        fVar34 = auVar40._8_4_;
        auVar63._8_4_ = fVar34 * 0.0;
        fVar61 = auVar40._12_4_;
        auVar63._12_4_ = fVar61 * 0.0;
        auVar37 = vfmadd213ps_fma(auVar53,auVar49,auVar63);
        auVar45 = vfmadd231ps_fma(auVar37,auVar42,auVar45);
        uVar50 = auVar38._0_4_;
        auVar77._4_4_ = uVar50;
        auVar77._0_4_ = uVar50;
        auVar77._8_4_ = uVar50;
        auVar77._12_4_ = uVar50;
        auVar37 = vshufps_avx(auVar38,auVar38,0x55);
        auVar37 = vfmadd213ps_fma(auVar37,auVar49,auVar63);
        auVar40 = vfmadd231ps_fma(auVar37,auVar42,auVar77);
        uVar50 = auVar39._0_4_;
        auVar75._4_4_ = uVar50;
        auVar75._0_4_ = uVar50;
        auVar75._8_4_ = uVar50;
        auVar75._12_4_ = uVar50;
        auVar37 = vshufps_avx(auVar39,auVar39,0x55);
        auVar38 = vshufps_avx(auVar39,auVar39,0xaa);
        auVar39._0_4_ = auVar38._0_4_ * fVar51;
        auVar39._4_4_ = auVar38._4_4_ * fVar68;
        auVar39._8_4_ = auVar38._8_4_ * fVar34;
        auVar39._12_4_ = auVar38._12_4_ * fVar61;
        auVar37 = vfmadd231ps_fma(auVar39,auVar49,auVar37);
        auVar39 = vfmadd231ps_fma(auVar37,auVar42,auVar75);
        uVar50 = auVar41._0_4_;
        auVar73._4_4_ = uVar50;
        auVar73._0_4_ = uVar50;
        auVar73._8_4_ = uVar50;
        auVar73._12_4_ = uVar50;
        auVar37 = vshufps_avx(auVar41,auVar41,0x55);
        auVar38 = vshufps_avx(auVar41,auVar41,0xaa);
        auVar53._0_4_ = auVar38._0_4_ * fVar51;
        auVar53._4_4_ = auVar38._4_4_ * fVar68;
        auVar53._8_4_ = auVar38._8_4_ * fVar34;
        auVar53._12_4_ = auVar38._12_4_ * fVar61;
        auVar37 = vfmadd231ps_fma(auVar53,auVar49,auVar37);
        auVar37 = vfmadd231ps_fma(auVar37,auVar42,auVar73);
        auVar38._0_4_ = auVar36._0_4_ + 0.0 + auVar37._0_4_;
        auVar38._4_4_ = auVar36._4_4_ + 0.0 + auVar37._4_4_;
        auVar38._8_4_ = auVar36._8_4_ + 0.0 + auVar37._8_4_;
        auVar38._12_4_ = auVar36._12_4_ + 0.0 + auVar37._12_4_;
      }
      else {
        fVar51 = 1.0 - fVar68;
        auVar52._0_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[0];
        auVar52._4_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[1];
        auVar52._8_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[2];
        auVar52._12_4_ = fVar68 * (pAVar31->l).vx.field_0.m128[3];
        auVar64._4_4_ = fVar51;
        auVar64._0_4_ = fVar51;
        auVar64._8_4_ = fVar51;
        auVar64._12_4_ = fVar51;
        auVar45 = vfmadd231ps_fma(auVar52,auVar64,(undefined1  [16])(pAVar29->l).vx.field_0);
        auVar54._0_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[0];
        auVar54._4_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[1];
        auVar54._8_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[2];
        auVar54._12_4_ = fVar68 * (pAVar31->l).vy.field_0.m128[3];
        auVar40 = vfmadd231ps_fma(auVar54,auVar64,(undefined1  [16])(pAVar29->l).vy.field_0);
        auVar62._0_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[0];
        auVar62._4_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[1];
        auVar62._8_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[2];
        auVar62._12_4_ = fVar68 * (pAVar31->l).vz.field_0.m128[3];
        auVar39 = vfmadd231ps_fma(auVar62,auVar64,(undefined1  [16])(pAVar29->l).vz.field_0);
        auVar57._0_4_ = fVar68 * (pAVar31->p).field_0.m128[0];
        auVar57._4_4_ = fVar68 * (pAVar31->p).field_0.m128[1];
        auVar57._8_4_ = fVar68 * (pAVar31->p).field_0.m128[2];
        auVar57._12_4_ = fVar68 * (pAVar31->p).field_0.m128[3];
        auVar38 = vfmadd231ps_fma(auVar57,auVar64,(undefined1  [16])(pAVar29->p).field_0);
      }
      auVar36 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar37 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar71._0_4_ = auVar39._0_4_ * auVar37._0_4_;
      auVar71._4_4_ = auVar39._4_4_ * auVar37._4_4_;
      auVar71._8_4_ = auVar39._8_4_ * auVar37._8_4_;
      auVar71._12_4_ = auVar39._12_4_ * auVar37._12_4_;
      auVar49 = vfmsub231ps_fma(auVar71,auVar40,auVar36);
      auVar41 = vshufps_avx(auVar49,auVar49,0xc9);
      auVar42 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar65._0_4_ = auVar45._0_4_ * auVar36._0_4_;
      auVar65._4_4_ = auVar45._4_4_ * auVar36._4_4_;
      auVar65._8_4_ = auVar45._8_4_ * auVar36._8_4_;
      auVar65._12_4_ = auVar45._12_4_ * auVar36._12_4_;
      auVar43 = vfmsub231ps_fma(auVar65,auVar42,auVar39);
      auVar55._0_4_ = auVar42._0_4_ * auVar40._0_4_;
      auVar55._4_4_ = auVar42._4_4_ * auVar40._4_4_;
      auVar55._8_4_ = auVar42._8_4_ * auVar40._8_4_;
      auVar55._12_4_ = auVar42._12_4_ * auVar40._12_4_;
      auVar39 = vfmsub231ps_fma(auVar55,auVar45,auVar37);
      auVar36 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar37 = vunpcklps_avx(auVar41,auVar36);
      auVar39 = vunpcklps_avx(auVar49,auVar39);
      auVar36 = vinsertps_avx(auVar43,auVar43,0x4a);
      auVar39 = vunpcklps_avx(auVar39,ZEXT416(auVar43._0_4_));
      auVar40 = vunpcklps_avx(auVar37,auVar36);
      auVar37 = vunpckhps_avx(auVar37,auVar36);
      auVar36 = vdpps_avx(auVar45,auVar41,0x7f);
      uVar50 = auVar36._0_4_;
      auVar69._4_4_ = uVar50;
      auVar69._0_4_ = uVar50;
      auVar69._8_4_ = uVar50;
      auVar69._12_4_ = uVar50;
      aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar40,auVar69);
      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar37,auVar69);
      aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar39,auVar69);
      uVar50 = auVar38._0_4_;
      auVar66._4_4_ = uVar50;
      auVar66._0_4_ = uVar50;
      auVar66._8_4_ = uVar50;
      auVar66._12_4_ = uVar50;
      auVar36 = vshufps_avx(auVar38,auVar38,0x55);
      auVar37 = vshufps_avx(auVar38,auVar38,0xaa);
      auVar58._0_4_ = auVar37._0_4_ * aVar7.m128[0];
      auVar58._4_4_ = auVar37._4_4_ * aVar7.m128[1];
      auVar58._8_4_ = auVar37._8_4_ * aVar7.m128[2];
      auVar58._12_4_ = auVar37._12_4_ * aVar7.m128[3];
      auVar36 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar6,auVar36);
      auVar36 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar66);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      aVar35 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vxorps_avx512vl(auVar36,auVar23);
    }
    uVar25 = *(undefined8 *)&(ray->super_RayK<1>).org.field_0;
    uVar26 = *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    uVar13 = *(undefined8 *)&(ray->super_RayK<1>).dir.field_0;
    uVar24 = *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    uVar50 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar17._4_4_ = uVar50;
    auVar17._0_4_ = uVar50;
    auVar17._8_4_ = uVar50;
    auVar17._12_4_ = uVar50;
    auVar36 = vfmadd231ps_avx512vl((undefined1  [16])aVar35,(undefined1  [16])aVar7,auVar17);
    uVar50 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar18._4_4_ = uVar50;
    auVar18._0_4_ = uVar50;
    auVar18._8_4_ = uVar50;
    auVar18._12_4_ = uVar50;
    auVar36 = vfmadd231ps_avx512vl(auVar36,(undefined1  [16])aVar6,auVar18);
    uVar50 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar19._4_4_ = uVar50;
    auVar19._0_4_ = uVar50;
    auVar19._8_4_ = uVar50;
    auVar19._12_4_ = uVar50;
    auVar36 = vfmadd231ps_avx512vl(auVar36,(undefined1  [16])aVar5,auVar19);
    aVar12 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx(auVar36,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),0x30);
    (ray->super_RayK<1>).org.field_0 = aVar12;
    uVar50 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    auVar20._4_4_ = uVar50;
    auVar20._0_4_ = uVar50;
    auVar20._8_4_ = uVar50;
    auVar20._12_4_ = uVar50;
    auVar36 = vmulps_avx512vl((undefined1  [16])aVar7,auVar20);
    uVar50 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar21._4_4_ = uVar50;
    auVar21._0_4_ = uVar50;
    auVar21._8_4_ = uVar50;
    auVar21._12_4_ = uVar50;
    auVar36 = vfmadd231ps_avx512vl(auVar36,(undefined1  [16])aVar6,auVar21);
    uVar50 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar22._4_4_ = uVar50;
    auVar22._0_4_ = uVar50;
    auVar22._8_4_ = uVar50;
    auVar22._12_4_ = uVar50;
    auVar36 = vfmadd231ps_avx512vl(auVar36,(undefined1  [16])aVar5,auVar22);
    aVar12 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx(auVar36,ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[3]),0x30);
    (ray->super_RayK<1>).dir.field_0 = aVar12;
    lVar10 = *(long *)&(pIVar8->super_Geometry).field_0x58;
    (**(code **)(lVar10 + 0x78))(lVar10 + 0x58,ray);
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = uVar25;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uVar26;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = uVar13;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uVar24;
    pRVar9->instID[0] = 0xffffffff;
    pRVar9->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersector1MB::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }